

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O2

void __thiscall Js::SourceDynamicProfileManager::Reuse(SourceDynamicProfileManager *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->dataCacheWrapper).ptr != (SimpleDataCacheWrapper *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x57,"(dataCacheWrapper == nullptr)",
                                "Persisted profiles cannot be re-used");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<const_BVFixed>::WriteBarrierSet
            (&this->cachedStartupFunctions,(this->startupFunctions).ptr);
  return;
}

Assistant:

void SourceDynamicProfileManager::Reuse()
    {
        AssertMsg(dataCacheWrapper == nullptr, "Persisted profiles cannot be re-used");
        cachedStartupFunctions = startupFunctions;
    }